

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

void __thiscall
prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
          (prevector<16U,_unsigned_char,_unsigned_int,_int> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *other)

{
  long lVar1;
  size_type sVar2;
  const_iterator first;
  const_iterator last;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  size_type in_stack_00000014;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_00000018;
  size_type n;
  uchar *in_stack_ffffffffffffffb8;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  difference_type_conflict pos;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffd8;
  
  pos = (difference_type_conflict)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->_union).indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&in_RDI->_union + 8) = 0;
  in_RDI->_size = 0;
  sVar2 = size(in_stack_ffffffffffffffc8);
  change_capacity(in_stack_00000018,in_stack_00000014);
  in_RDI->_size = in_RDI->_size + sVar2;
  item_ptr(in_stack_ffffffffffffffd8,pos);
  first = begin(in_RDI);
  last = end(in_RDI);
  fill<prevector<16U,_unsigned_char,_unsigned_int,_int>::const_iterator>
            (in_RDI,in_stack_ffffffffffffffb8,first,last);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

prevector(const prevector<N, T, Size, Diff>& other) {
        size_type n = other.size();
        change_capacity(n);
        _size += n;
        fill(item_ptr(0), other.begin(),  other.end());
    }